

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceCurveSweptAreaSolid::IfcSurfaceCurveSweptAreaSolid
          (IfcSurfaceCurveSweptAreaSolid *this)

{
  *(undefined ***)&this->field_0x80 = &PTR__Object_008a0070;
  *(undefined8 *)&this->field_0x88 = 0;
  *(char **)&this->field_0x90 = "IfcSurfaceCurveSweptAreaSolid";
  IfcSweptAreaSolid::IfcSweptAreaSolid
            (&this->super_IfcSweptAreaSolid,&PTR_construction_vtable_24__00911e88);
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x58 = 0;
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x60 = 0;
  (this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x911da8;
  *(undefined8 *)&this->field_0x80 = 0x911e70;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x911dd0;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x911df8;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    field_0x30 = 0x911e20;
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x50 = 0x911e48;
  (this->ReferenceSurface).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcSurfaceCurveSweptAreaSolid() : Object("IfcSurfaceCurveSweptAreaSolid") {}